

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void QConcatenable<QString>::appendTo(QString *a,QChar **out)

{
  long lVar1;
  char16_t *__src;
  
  lVar1 = (a->d).size;
  if (lVar1 != 0) {
    __src = (a->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(*out,__src,lVar1 * 2);
  }
  *out = *out + lVar1;
  return;
}

Assistant:

static inline void appendTo(const QString &a, QChar *&out)
    {
        const qsizetype n = a.size();
        if (n)
            memcpy(out, a.data(), sizeof(QChar) * n);
        out += n;
    }